

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void __thiscall TCMallocImplementation::MarkThreadBusy(TCMallocImplementation *this)

{
  void *pvVar1;
  int iVar2;
  ThreadCache *pTVar3;
  undefined8 *ptr;
  FreeList *pFVar4;
  ulong uVar5;
  Span *span;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long *in_FS_OFFSET;
  ThreadCachePtr TVar9;
  
  pTVar3 = (ThreadCache *)*in_FS_OFFSET;
  if (pTVar3 == (ThreadCache *)0x0) {
    TVar9 = tcmalloc::ThreadCachePtr::GetSlow();
    pTVar3 = TVar9.ptr_;
  }
  uVar7 = (uint)tcmalloc::Static::sizemap_;
  uVar5 = (ulong)tcmalloc::Static::sizemap_;
  iVar2 = pTVar3->list_[uVar5].size_;
  ptr = (undefined8 *)pTVar3->list_[uVar5].list_;
  if (ptr != (undefined8 *)0x0) {
    pFVar4 = pTVar3->list_ + uVar5;
    pFVar4->list_ = (void *)*ptr;
    uVar8 = pFVar4->length_ - 1;
    pFVar4->length_ = uVar8;
    if (uVar8 < pFVar4->lowater_) {
      pFVar4->lowater_ = uVar8;
    }
    if (ptr != (undefined8 *)0x0) {
      pTVar3->size_ = pTVar3->size_ - iVar2;
      goto LAB_00114e0a;
    }
  }
  ptr = (undefined8 *)
        tcmalloc::ThreadCache::FetchFromCentralCache
                  (pTVar3,uVar7,iVar2,anon_unknown.dwarf_505b::nop_oom_handler);
LAB_00114e0a:
  pTVar3 = (ThreadCache *)*in_FS_OFFSET;
  uVar5 = (ulong)ptr >> 0xd;
  uVar6 = *(ulong *)(tcmalloc::Static::pageheap_ + (uVar5 & 0xffff) * 8 + 0x10) ^
          uVar5 & 0xffffffffffff0000;
  if (0x7f < uVar6) {
    if (((ulong)ptr >> 0x30 == 0) &&
       (*(long *)(tcmalloc::Static::pageheap_ + ((ulong)ptr >> 0x1f) * 8 + 0x80010) != 0)) {
      span = *(Span **)(*(long *)(tcmalloc::Static::pageheap_ + ((ulong)ptr >> 0x1f) * 8 + 0x80010)
                       + (ulong)((uint)uVar5 & 0x3ffff) * 8);
    }
    else {
      span = (Span *)0x0;
    }
    if (span == (Span *)0x0) {
      if (ptr == (undefined8 *)0x0) {
        return;
      }
      anon_unknown.dwarf_505b::InvalidFree(ptr);
      return;
    }
    uVar6 = (ulong)(byte)span->field_0x2a;
    if (uVar6 == 0) {
      anon_unknown.dwarf_505b::do_free_pages(span,ptr);
      return;
    }
    *(ulong *)(tcmalloc::Static::pageheap_ + (uVar5 & 0xffff) * 8 + 0x10) =
         uVar5 & 0xffffffffffff0000 | uVar6;
  }
  if (pTVar3 == (ThreadCache *)0x0) {
    MarkThreadBusy();
  }
  else {
    uVar5 = uVar6 & 0xffffffff;
    uVar7 = pTVar3->list_[uVar5].length_ + 1;
    pvVar1 = pTVar3->list_[uVar5].list_;
    pTVar3->list_[uVar5].list_ = ptr;
    *ptr = pvVar1;
    pTVar3->list_[uVar5].length_ = uVar7;
    if (pTVar3->list_[uVar5].max_length_ < uVar7) {
      tcmalloc::ThreadCache::ListTooLong(pTVar3,pTVar3->list_ + uVar5,(uint32_t)uVar6);
      return;
    }
    iVar2 = pTVar3->size_ + pTVar3->list_[uVar5].size_;
    pTVar3->size_ = iVar2;
    if (pTVar3->max_size_ < iVar2) {
      tcmalloc::ThreadCache::Scavenge(pTVar3);
      return;
    }
  }
  return;
}

Assistant:

void TCMallocImplementation::MarkThreadBusy() {
  // Allocate to force the creation of a thread cache, but avoid
  // invoking any hooks.
  do_free(do_malloc(0));
}